

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

void Qentem::TestOutPut::ResetDoubleFormat(void)

{
  wstringstream *pwVar1;
  wstringstream **ppwVar2;
  wstringstream *wss;
  
  ppwVar2 = GetStreamCache_abi_cxx11_();
  pwVar1 = *ppwVar2;
  if (pwVar1 == (wstringstream *)0x0) {
    std::wostream::operator<<((wostream *)&std::wcout,std::defaultfloat);
    std::ios_base::precision((ios_base *)((long)&std::wcout + *(long *)(std::wcout + -0x18)),6);
  }
  else {
    std::wostream::operator<<((wostream *)(pwVar1 + 0x10),std::defaultfloat);
    std::ios_base::precision((ios_base *)(pwVar1 + *(long *)(*(long *)pwVar1 + -0x18)),6);
  }
  return;
}

Assistant:

static void ResetDoubleFormat() noexcept {
        std::wstringstream *wss = GetStreamCache();

        if (wss == nullptr) {
            std::wcout << std::defaultfloat;
            std::wcout.precision(6);
        } else {
            *wss << std::defaultfloat;
            wss->precision(6);
        }
    }